

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *pcVar2;
  cmTargetInternalPointer *pcVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  char *pcVar7;
  pointer s;
  char **p;
  undefined **ppuVar8;
  cmStringRange cVar9;
  cmBacktraceRange cVar10;
  string configUpper;
  string property;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  cmTargetInternalPointer *local_a8;
  cmListFileBacktrace *local_a0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_98;
  string *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_50;
  
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] = 0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->InstallPath)._M_dataplus._M_p = (pointer)&(this->InstallPath).field_2;
  (this->InstallPath)._M_string_length = 0;
  local_98 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->SystemIncludeDirectories;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)&(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_string_length = 0;
  local_90 = (string *)&this->Name;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  memset(&this->LinkDirectories,0,0x90);
  local_a8 = &this->Internal;
  cmTargetInternalPointer::cmTargetInternalPointer(&this->Internal);
  local_a0 = &this->Backtrace;
  cmListFileBacktrace::cmListFileBacktrace(local_a0);
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  std::__cxx11::string::_M_assign(local_90);
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = vis - VisibilityImported < 2;
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;
  this->RecordDependencies = type - STATIC_LIBRARY < 3;
  std::__cxx11::string::string((string *)&configUpper,"WIN32",&local_ab);
  bVar4 = cmMakefile::IsOn(mf,&configUpper);
  if (bVar4) {
    this->DLLPlatform = true;
  }
  else {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string((string *)&property,"CYGWIN",&local_a9);
    bVar4 = cmMakefile::IsOn(pcVar2,&property);
    if (bVar4) {
      this->DLLPlatform = true;
    }
    else {
      pcVar2 = this->Makefile;
      std::__cxx11::string::string((string *)&configNames,"MINGW",&local_aa);
      bVar4 = cmMakefile::IsOn(pcVar2,(string *)&configNames);
      this->DLLPlatform = bVar4;
      std::__cxx11::string::~string((string *)&configNames);
    }
    std::__cxx11::string::~string((string *)&property);
  }
  std::__cxx11::string::~string((string *)&configUpper);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string((string *)&configUpper,"CMAKE_SYSTEM_NAME",(allocator *)&property);
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar2,&configUpper);
  iVar5 = strcmp(pcVar7,"Android");
  this->IsAndroid = iVar5 == 0;
  std::__cxx11::string::~string((string *)&configUpper);
  if (this->TargetTypeValue != UTILITY) {
    if (this->TargetTypeValue != INTERFACE_LIBRARY) {
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_API",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_API_MIN",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_ARCH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_STL_TYPE",(allocator *)&property)
      ;
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_SKIP_ANT_STEP",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_PROCESS_MAX",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_PROGUARD",(allocator *)&property)
      ;
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_PROGUARD_CONFIG_PATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_SECURE_PROPS_PATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_NATIVE_LIB_DIRECTORIES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_NATIVE_LIB_DEPENDENCIES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_JAVA_SOURCE_DIR",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_JAR_DIRECTORIES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_JAR_DEPENDENCIES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_ASSETS_DIRECTORIES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ANDROID_ANT_ADDITIONAL_OPTIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"BUILD_RPATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"INSTALL_NAME_DIR",(allocator *)&property)
      ;
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"INSTALL_RPATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,"");
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"INSTALL_RPATH_USE_LINK_PATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,"OFF");
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"INTERPROCEDURAL_OPTIMIZATION",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"SKIP_BUILD_RPATH",(allocator *)&property)
      ;
      SetPropertyDefault(this,&configUpper,"OFF");
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"BUILD_WITH_INSTALL_RPATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,"OFF");
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"ARCHIVE_OUTPUT_DIRECTORY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"LIBRARY_OUTPUT_DIRECTORY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"RUNTIME_OUTPUT_DIRECTORY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"PDB_OUTPUT_DIRECTORY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"Fortran_FORMAT",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"Fortran_MODULE_DIRECTORY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"GNUtoMS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"OSX_ARCHITECTURES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"IOS_INSTALL_COMBINED",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"AUTOMOC",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"AUTOUIC",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"AUTORCC",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"AUTOMOC_DEPEND_FILTERS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"AUTOMOC_MOC_OPTIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"AUTOUIC_OPTIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"AUTOUIC_SEARCH_PATHS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"AUTORCC_OPTIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"LINK_DEPENDS_NO_SHARED",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"LINK_INTERFACE_LIBRARIES",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"WIN32_EXECUTABLE",(allocator *)&property)
      ;
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"MACOSX_BUNDLE",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"MACOSX_RPATH",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"BUILD_WITH_INSTALL_NAME_DIR",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"C_CLANG_TIDY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"C_COMPILER_LAUNCHER",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"C_CPPLINT",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"C_INCLUDE_WHAT_YOU_USE",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"LINK_WHAT_YOU_USE",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"C_STANDARD",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"C_STANDARD_REQUIRED",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"C_EXTENSIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"CXX_CLANG_TIDY",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CXX_COMPILER_LAUNCHER",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"CXX_CPPLINT",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CXX_INCLUDE_WHAT_YOU_USE",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"CXX_STANDARD",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CXX_STANDARD_REQUIRED",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"CXX_EXTENSIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"CUDA_STANDARD",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CUDA_STANDARD_REQUIRED",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"CUDA_EXTENSIONS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CUDA_COMPILER_LAUNCHER",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"LINK_SEARCH_START_STATIC",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"LINK_SEARCH_END_STATIC",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      if (this->TargetTypeValue == UTILITY) goto LAB_00338d9b;
    }
    std::__cxx11::string::string
              ((string *)&configUpper,"NO_SYSTEM_FROM_IMPORTED",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
LAB_00338d9b:
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,mf,&configNames,true);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->TargetTypeValue != UTILITY) {
    for (s = configNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != configNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      cmsys::SystemTools::UpperCase(&configUpper,s);
      ppuVar8 = &PTR_anon_var_dwarf_32355c_006a9240;
      while( true ) {
        pcVar7 = *ppuVar8;
        TVar6 = this->TargetTypeValue;
        if (pcVar7 == (char *)0x0) break;
        if (TVar6 == INTERFACE_LIBRARY) {
          iVar5 = strcmp(pcVar7,"MAP_IMPORTED_CONFIG_");
          if (iVar5 == 0) goto LAB_00339256;
        }
        else {
LAB_00339256:
          std::__cxx11::string::string((string *)&property,pcVar7,&local_ab);
          std::__cxx11::string::append((string *)&property);
          SetPropertyDefault(this,&property,(char *)0x0);
          std::__cxx11::string::~string((string *)&property);
        }
        ppuVar8 = ppuVar8 + 1;
      }
      if ((TVar6 != EXECUTABLE) && (TVar6 != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&property,s);
        std::__cxx11::string::append((char *)&property);
        SetPropertyDefault(this,&property,(char *)0x0);
        std::__cxx11::string::~string((string *)&property);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
  }
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&configUpper,this->Makefile);
  cmListFileBacktrace::operator=(local_a0,(cmListFileBacktrace *)&configUpper);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&configUpper);
  if (this->IsImportedTarget == false) {
    cVar9 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar10 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    pcVar3 = local_a8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_a8->Pointer,
               (local_a8->Pointer->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar9.Begin._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar9.End._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar3->Pointer->IncludeDirectoriesBacktraces,
               (pcVar3->Pointer->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,(cmListFileBacktrace *)cVar10.Begin._M_current,
               (cmListFileBacktrace *)cVar10.End._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&configUpper,&(this->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              (local_98,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )configUpper.field_2._8_8_,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&configUpper._M_string_length);
    cVar9 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    cVar10 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    pcVar3 = local_a8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_a8->Pointer->CompileOptionsEntries,
               (local_a8->Pointer->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar9.Begin._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar9.End._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar3->Pointer->CompileOptionsBacktraces,
               (pcVar3->Pointer->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,(cmListFileBacktrace *)cVar10.Begin._M_current,
               (cmListFileBacktrace *)cVar10.End._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&configUpper);
  }
  TVar6 = this->TargetTypeValue;
  if ((TVar6 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string
              ((string *)&configUpper,"C_VISIBILITY_PRESET",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"CXX_VISIBILITY_PRESET",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"CUDA_VISIBILITY_PRESET",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"VISIBILITY_INLINES_HIDDEN",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar6 = this->TargetTypeValue;
    if (TVar6 == EXECUTABLE) {
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_GUI",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CROSSCOMPILING_EMULATOR",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"ENABLE_EXPORTS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      TVar6 = this->TargetTypeValue;
    }
  }
  if ((TVar6 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    std::__cxx11::string::string
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator *)&property);
    SetProperty(this,&configUpper,"True");
    std::__cxx11::string::~string((string *)&configUpper);
    TVar6 = this->TargetTypeValue;
  }
  if ((TVar6 & ~SHARED_LIBRARY) == EXECUTABLE) {
    std::__cxx11::string::string
              ((string *)&configUpper,"WINDOWS_EXPORT_ALL_SYMBOLS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar6 = this->TargetTypeValue;
  }
  if ((TVar6 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  TVar6 = this->TargetTypeValue;
  if (TVar6 == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
    TVar6 = this->TargetTypeValue;
    if (TVar6 == INTERFACE_LIBRARY) goto LAB_003391cd;
  }
  if (TVar6 != UTILITY) {
    std::__cxx11::string::string((string *)&configUpper,"JOB_POOL_COMPILE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"JOB_POOL_LINK",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
LAB_003391cd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configNames);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // only add dependency information for library targets
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY) {
    this->RecordDependencies = true;
  } else {
    this->RecordDependencies = false;
  }

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    (this->Makefile->IsOn("WIN32") || this->Makefile->IsOn("CYGWIN") ||
     this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_API_MIN", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ARCH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_STL_TYPE", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", CM_NULLPTR);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_FORMAT", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("GNUtoMS", CM_NULLPTR);
    this->SetPropertyDefault("OSX_ARCHITECTURES", CM_NULLPTR);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", CM_NULLPTR);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", CM_NULLPTR);
    this->SetPropertyDefault("WIN32_EXECUTABLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_BUNDLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("C_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("C_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("C_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CXX_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", CM_NULLPTR);
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    const char* configProps[] = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_", CM_NULLPTR
    };
    for (std::vector<std::string>::iterator ci = configNames.begin();
         ci != configNames.end(); ++ci) {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for (const char** p = configProps; *p; ++p) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, CM_NULLPTR);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, CM_NULLPTR);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(), parentOptions.begin(),
      parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(), parentOptionsBts.begin(),
      parentOptionsBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", CM_NULLPTR);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", CM_NULLPTR);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", CM_NULLPTR);
    this->SetPropertyDefault("ENABLE_EXPORTS", CM_NULLPTR);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", CM_NULLPTR);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", CM_NULLPTR);
    this->SetPropertyDefault("JOB_POOL_LINK", CM_NULLPTR);
  }
}